

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O0

Triple * __thiscall llvm::Triple::get64BitArchVariant(Triple *__return_storage_ptr__,Triple *this)

{
  ArchType AVar1;
  Triple *this_local;
  Triple *T;
  
  Triple(__return_storage_ptr__,this);
  AVar1 = getArch(this);
  switch(AVar1) {
  case UnknownArch:
  case arc:
  case avr:
  case hexagon:
  case msp430:
  case nios2:
  case r600:
  case sparcel:
  case tce:
  case tcele:
  case xcore:
  case kalimba:
  case shave:
  case lanai:
    setArch(__return_storage_ptr__,UnknownArch);
    break;
  case arm:
    setArch(__return_storage_ptr__,aarch64);
    break;
  case armeb:
    setArch(__return_storage_ptr__,aarch64_be);
    break;
  case aarch64:
  case aarch64_be:
  case bpfel:
  case bpfeb:
  case mips64:
  case mips64el:
  case ppc64:
  case ppc64le:
  case amdgcn:
  case riscv64:
  case sparcv9:
  case systemz:
  case x86_64:
  case nvptx64:
  case le64:
  case amdil64:
  case hsail64:
  case spir64:
  case wasm64:
  case LastArchType:
    break;
  case mips:
    setArch(__return_storage_ptr__,mips64);
    break;
  case mipsel:
    setArch(__return_storage_ptr__,mips64el);
    break;
  case ppc:
    setArch(__return_storage_ptr__,ppc64);
    break;
  case riscv32:
    setArch(__return_storage_ptr__,riscv64);
    break;
  case sparc:
    setArch(__return_storage_ptr__,sparcv9);
    break;
  case thumb:
    setArch(__return_storage_ptr__,aarch64);
    break;
  case thumbeb:
    setArch(__return_storage_ptr__,aarch64_be);
    break;
  case x86:
    setArch(__return_storage_ptr__,x86_64);
    break;
  case nvptx:
    setArch(__return_storage_ptr__,nvptx64);
    break;
  case le32:
    setArch(__return_storage_ptr__,le64);
    break;
  case amdil:
    setArch(__return_storage_ptr__,amdil64);
    break;
  case hsail:
    setArch(__return_storage_ptr__,hsail64);
    break;
  case spir:
    setArch(__return_storage_ptr__,spir64);
    break;
  case wasm32:
    setArch(__return_storage_ptr__,wasm64);
    break;
  case renderscript32:
    setArch(__return_storage_ptr__,LastArchType);
  }
  return __return_storage_ptr__;
}

Assistant:

Triple Triple::get64BitArchVariant() const {
  Triple T(*this);
  switch (getArch()) {
  case Triple::UnknownArch:
  case Triple::arc:
  case Triple::avr:
  case Triple::hexagon:
  case Triple::kalimba:
  case Triple::lanai:
  case Triple::msp430:
  case Triple::nios2:
  case Triple::r600:
  case Triple::tce:
  case Triple::tcele:
  case Triple::xcore:
  case Triple::sparcel:
  case Triple::shave:
    T.setArch(UnknownArch);
    break;

  case Triple::aarch64:
  case Triple::aarch64_be:
  case Triple::bpfel:
  case Triple::bpfeb:
  case Triple::le64:
  case Triple::amdil64:
  case Triple::amdgcn:
  case Triple::hsail64:
  case Triple::spir64:
  case Triple::mips64:
  case Triple::mips64el:
  case Triple::nvptx64:
  case Triple::ppc64:
  case Triple::ppc64le:
  case Triple::riscv64:
  case Triple::sparcv9:
  case Triple::systemz:
  case Triple::x86_64:
  case Triple::wasm64:
  case Triple::renderscript64:
    // Already 64-bit.
    break;

  case Triple::arm:             T.setArch(Triple::aarch64);    break;
  case Triple::armeb:           T.setArch(Triple::aarch64_be); break;
  case Triple::le32:            T.setArch(Triple::le64);       break;
  case Triple::mips:            T.setArch(Triple::mips64);     break;
  case Triple::mipsel:          T.setArch(Triple::mips64el);   break;
  case Triple::nvptx:           T.setArch(Triple::nvptx64);    break;
  case Triple::ppc:             T.setArch(Triple::ppc64);      break;
  case Triple::sparc:           T.setArch(Triple::sparcv9);    break;
  case Triple::riscv32:         T.setArch(Triple::riscv64);    break;
  case Triple::x86:             T.setArch(Triple::x86_64);     break;
  case Triple::amdil:           T.setArch(Triple::amdil64);    break;
  case Triple::hsail:           T.setArch(Triple::hsail64);    break;
  case Triple::spir:            T.setArch(Triple::spir64);     break;
  case Triple::thumb:           T.setArch(Triple::aarch64);    break;
  case Triple::thumbeb:         T.setArch(Triple::aarch64_be); break;
  case Triple::wasm32:          T.setArch(Triple::wasm64);     break;
  case Triple::renderscript32:  T.setArch(Triple::renderscript64);     break;
  }
  return T;
}